

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzer.cpp
# Opt level: O0

U8 __thiscall
LINAnalyzer::GetBreakField
          (LINAnalyzer *this,S64 *startingSample,S64 *endingSample,bool *framingError)

{
  int iVar1;
  MarkerType MVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  S64 SVar6;
  element_type *peVar7;
  double dVar8;
  undefined1 auVar9 [16];
  uint local_38;
  U32 i;
  bool valid_fame;
  U32 num_break_bits;
  U32 min_break_field_low_bits;
  bool *framingError_local;
  S64 *endingSample_local;
  S64 *startingSample_local;
  LINAnalyzer *this_local;
  
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    iVar1 = AnalyzerChannelData::GetBitState();
    if (iVar1 == 1) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    lVar4 = AnalyzerChannelData::GetSampleOfNextEdge();
    lVar5 = AnalyzerChannelData::GetSampleNumber();
    lVar4 = lVar4 - lVar5;
    auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = 0x45300000;
    dVar8 = SamplesPerBit(this);
    dVar8 = round(((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / dVar8);
  } while ((uint)(long)dVar8 < 0xd);
  SVar6 = AnalyzerChannelData::GetSampleNumber();
  *startingSample = SVar6;
  for (local_38 = 0; local_38 < (uint)(long)dVar8; local_38 = local_38 + 1) {
    if (local_38 == 0) {
      AdvanceHalfBit(this);
    }
    else {
      Advance(this,1);
    }
    peVar7 = std::auto_ptr<LINAnalyzerResults>::operator->(&this->mResults);
    MVar2 = AnalyzerChannelData::GetSampleNumber();
    iVar1 = AnalyzerChannelData::GetBitState();
    uVar3 = 0xb;
    if (iVar1 == 1) {
      uVar3 = 10;
    }
    std::auto_ptr<LINAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar7,MVar2,(Channel *)(ulong)uVar3);
  }
  Advance(this,1);
  iVar1 = AnalyzerChannelData::GetBitState();
  if (iVar1 == 1) {
    peVar7 = std::auto_ptr<LINAnalyzerResults>::operator->(&this->mResults);
    MVar2 = AnalyzerChannelData::GetSampleNumber();
    std::auto_ptr<LINAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar7,MVar2,(Channel *)0x9);
    *framingError = false;
  }
  else {
    peVar7 = std::auto_ptr<LINAnalyzerResults>::operator->(&this->mResults);
    MVar2 = AnalyzerChannelData::GetSampleNumber();
    std::auto_ptr<LINAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar7,MVar2,(Channel *)0x3);
    *framingError = true;
  }
  SVar6 = AnalyzerChannelData::GetSampleNumber();
  *endingSample = SVar6;
  return '\0';
}

Assistant:

U8 LINAnalyzer::GetBreakField( S64& startingSample, S64& endingSample, bool& framingError )
{
    // locate the start bit (falling edge expected)...
    U32 min_break_field_low_bits =
        13; // as per the spec of LIN. at least 13 bits at master speed, but receiver only needs it to be 11 or more.
    U32 num_break_bits = 0;
    bool valid_fame = false;
    for( ;; )
    {
        mSerial->AdvanceToNextEdge();
        if( mSerial->GetBitState() == BIT_HIGH )
        {
            mSerial->AdvanceToNextEdge();
        }
        num_break_bits = round( double( mSerial->GetSampleOfNextEdge() - mSerial->GetSampleNumber() ) / SamplesPerBit() );
        if( num_break_bits >= min_break_field_low_bits )
        {
            startingSample = mSerial->GetSampleNumber();
            valid_fame = true;
            break;
        }
    }

    // AdvanceHalfBit( );
    // mResults->AddMarker( mSerial->GetSampleNumber( ), AnalyzerResults::Start, mSettings->mInputChannel );

    for( U32 i = 0; i < num_break_bits; i++ )
    {
        if( i == 0 )
            AdvanceHalfBit();
        else
            Advance( 1 );
        // let's put a dot exactly where we sample this bit:
        mResults->AddMarker( mSerial->GetSampleNumber(), mSerial->GetBitState() == BIT_HIGH ? AnalyzerResults::One : AnalyzerResults::Zero,
                             mSettings->mInputChannel );
    }

    // Validate the stop bit...
    Advance( 1 );
    if( mSerial->GetBitState() == BIT_HIGH )
    {
        mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::Stop, mSettings->mInputChannel );
        framingError = false;
    }
    else
    {
        mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::ErrorSquare, mSettings->mInputChannel );
        framingError = true;
    }

    endingSample = mSerial->GetSampleNumber();

    return ( valid_fame ) ? 0 : 1;
}